

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

char * read_line(FILE *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  void *__ptr;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  __ptr = malloc(0x100);
  iVar6 = 0x100;
  uVar8 = 0;
  bVar2 = false;
  do {
    uVar7 = uVar8;
    iVar3 = fgetc((FILE *)file);
    if ((long)iVar6 <= (long)uVar7) {
      iVar6 = iVar6 + 0x100;
      __ptr = realloc(__ptr,(long)iVar6);
    }
    iVar5 = 0;
    bVar1 = true;
    if ((iVar3 != -1) && (iVar3 != 10)) {
      iVar5 = iVar3;
      bVar1 = bVar2;
    }
    *(char *)((long)__ptr + uVar7) = (char)iVar5;
    uVar8 = uVar7 + 1;
    bVar2 = bVar1;
  } while (!bVar1);
  if (*(char *)((long)__ptr + (uVar7 & 0xffffffff)) == '\r') {
    *(undefined1 *)((long)__ptr + (uVar7 & 0xffffffff)) = 0;
    uVar8 = uVar7;
  }
  pcVar4 = (char *)realloc(__ptr,(long)(int)uVar8);
  return pcVar4;
}

Assistant:

char *read_line(FILE *file)
{
	int size = BLOCK_SIZE;
	char *res = malloc(BLOCK_SIZE * sizeof(char));
	int ch;
	int i = 0;
	int isEnd = 0;
	do
	{
		ch = fgetc(file);
		if (i >= size)
		{
			size += BLOCK_SIZE;
			res = realloc(res, size * sizeof(char));
		}
		if (ch == '\n' || ch == EOF)
		{
			res[i++] = '\0';
			isEnd = 1;
		}
		else
		{
			res[i++] = (char) ch;
		}
	} while (!isEnd);
	if (i > 0 && res[i - 1] == '\r')
    {
        res[i - 1] = '\0';
        i--;
    }
	return realloc(res, i * sizeof(char));
}